

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-readable-on-eof.c
# Opt level: O0

void read_cb(uv_stream_t *tcp,ssize_t nread,uv_buf_t *buf)

{
  int64_t eval_b_1;
  int64_t eval_a_1;
  void *eval_b;
  void *eval_a;
  uv_buf_t *buf_local;
  ssize_t nread_local;
  uv_stream_t *tcp_local;
  
  if (tcp == (uv_stream_t *)0x0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%p %s %p)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-tcp-writealot.c"
            ,0x55,"tcp","!=","NULL",0,"!=",0);
    abort();
  }
  if (nread < 0) {
    if (nread != -0xfff) {
      fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-tcp-writealot.c"
              ,0x5b,"nread","==","UV_EOF",nread,"==",0xfffffffffffff001);
      abort();
    }
    printf("GOT EOF\n");
    uv_close(tcp,close_cb);
  }
  else {
    bytes_received_done = nread + bytes_received_done;
  }
  free(buf->base);
  return;
}

Assistant:

static void read_cb(uv_stream_t* handle, ssize_t nread, const uv_buf_t* buf) {
  int r;

  ASSERT_EQ(nread, UV_EOF);
  ASSERT_EQ(1, uv_is_readable(handle));
  ASSERT_EQ(1, uv_is_writable(handle));

  if (++read_cb_called == 3) {
      uv_close((uv_handle_t*) handle, close_cb);
      ASSERT_OK(uv_is_readable(handle));
      ASSERT_OK(uv_is_writable(handle));
  } else {
      r = uv_read_start((uv_stream_t*) &tcp_client, alloc_cb, read_cb);
      ASSERT_OK(r);
  }
}